

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

void __thiscall
cfd::core::AbstractTxInReference::AbstractTxInReference
          (AbstractTxInReference *this,AbstractTxIn *tx_in)

{
  this->_vptr_AbstractTxInReference = (_func_int **)&PTR__AbstractTxInReference_007236a8;
  Txid::Txid(&this->txid_,&tx_in->txid_);
  this->vout_ = tx_in->vout_;
  Script::Script(&this->unlocking_script_,&tx_in->unlocking_script_);
  this->sequence_ = tx_in->sequence_;
  (this->script_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&(this->script_witness_).witness_stack_,&(tx_in->script_witness_).witness_stack_);
  return;
}

Assistant:

AbstractTxInReference::AbstractTxInReference(const AbstractTxIn &tx_in)
    : txid_(tx_in.GetTxid()),
      vout_(tx_in.GetVout()),
      unlocking_script_(tx_in.GetUnlockingScript()),
      sequence_(tx_in.GetSequence()),
      script_witness_(tx_in.GetScriptWitness()) {
  // do nothing
}